

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O1

int vfio_disable_msix(int device_fd)

{
  __off_t __offset;
  long lVar1;
  ulong uVar2;
  code *pcVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  code *pcVar8;
  ssize_t sVar9;
  size_t sVar10;
  char *pcVar11;
  void *pvVar12;
  int __timeout;
  epoll_event *__events;
  undefined4 uVar13;
  ulong uVar14;
  char *__buf;
  undefined1 *puVar15;
  epoll_event *peVar16;
  ulong unaff_R12;
  long lVar17;
  ulong *puVar18;
  code *unaff_R15;
  char irq_set_buf [152];
  char buf [512];
  undefined8 auStack_2e28 [2];
  size_t asStack_2e18 [67];
  long lStack_2c00;
  int iStack_2bf8;
  uint uStack_2bf4;
  undefined8 uStack_2bf0;
  undefined1 auStack_2be8 [512];
  stat sStack_29e8;
  char acStack_2958 [4096];
  char acStack_1958 [4096];
  ulong auStack_958 [3];
  epoll_event aeStack_93c [33];
  undefined8 uStack_728;
  undefined8 uStack_720;
  epoll_event aeStack_718 [32];
  undefined1 auStack_518 [8];
  ulong uStack_510;
  ulong uStack_508;
  code *pcStack_4e8;
  ulong uStack_4e0;
  int iStack_4d8;
  undefined4 uStack_4d4;
  undefined1 auStack_4d0 [512];
  ulong uStack_2d0;
  undefined1 local_208 [512];
  
  fprintf(_stdout,"[INFO ] %s:%d %s(): Disable MSIX Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x81,
          "vfio_disable_msix");
  iVar4 = ioctl(device_fd,0x3b6e);
  if (iVar4 != -1) {
    return 0;
  }
  puVar15 = local_208;
  vfio_disable_msix_cold_1();
  puVar18 = &uStack_4e0;
  pcStack_4e8 = (code *)0x101dd2;
  uStack_2d0 = (ulong)(uint)device_fd;
  fprintf(_stdout,"[INFO ] %s:%d %s(): Setup VFIO Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x97,
          "vfio_setup_interrupt");
  pcVar3 = (code *)0x2;
  while( true ) {
    pcVar8 = pcVar3;
    uStack_4e0 = 0x10;
    iVar6 = (int)pcVar8;
    uStack_4d4 = 0;
    uVar14 = 0x3b6d;
    pcStack_4e8 = (code *)0x101dff;
    iStack_4d8 = iVar6;
    iVar4 = ioctl((int)puVar15,0x3b6d,&uStack_4e0);
    uVar2 = uStack_4e0;
    if (iVar4 == -1) break;
    unaff_R12 = uStack_4e0 >> 0x20;
    if ((uStack_4e0 & 0x100000000) == 0) {
      pcStack_4e8 = (code *)0x101e26;
      vfio_setup_interrupt_cold_1();
      pcVar8 = (code *)((ulong)unaff_R15 & 0xffffffff);
    }
    if ((uVar2 & 0x100000000) != 0) {
      return (int)pcVar8;
    }
    pcVar3 = (code *)(ulong)(iVar6 - 1);
    unaff_R15 = pcVar8;
    if (iVar6 == 0) {
      return -1;
    }
  }
  iVar4 = (int)auStack_4d0;
  pcStack_4e8 = vfio_epoll_wait;
  vfio_setup_interrupt_cold_2();
  lVar1 = -((uVar14 & 0xffffffff) * 0xc + 0xf & 0xfffffffffffffff0);
  __events = (epoll_event *)((long)aeStack_718 + lVar1);
  uStack_510 = (ulong)puVar15 & 0xffffffff;
  uStack_508 = unaff_R12;
  pcStack_4e8 = pcVar8;
  *(undefined8 *)((long)&uStack_720 + lVar1) = 0x101e85;
  uVar5 = epoll_wait(iVar4,__events,(int)uVar14,__timeout);
  if (uVar5 != 0xffffffff) {
    puVar18 = (ulong *)(ulong)uVar5;
    if (0 < (int)uVar5) {
      lVar17 = 0;
      do {
        iVar4 = *(int *)((long)aeStack_718 + lVar17 + lVar1 + 4);
        *(undefined8 *)((long)&uStack_720 + lVar1) = 0x101eb5;
        sVar9 = read(iVar4,auStack_518,8);
        if (sVar9 == -1) {
          *(undefined8 *)((long)&uStack_720 + lVar1) = 0x101ee2;
          vfio_epoll_wait_cold_1();
          goto LAB_00101ee2;
        }
        lVar17 = lVar17 + 0xc;
      } while ((long)puVar18 * 0xc != lVar17);
    }
    return uVar5;
  }
LAB_00101ee2:
  peVar16 = aeStack_718;
  *(code **)((long)&uStack_720 + lVar1) = vfio_epoll_ctl;
  vfio_epoll_wait_cold_2();
  *(code ***)((long)&uStack_720 + lVar1) = &pcStack_4e8;
  *(epoll_event **)((long)&uStack_728 + lVar1) = __events;
  *(undefined4 *)((long)aeStack_93c + lVar1) = 1;
  *(int *)((long)aeStack_93c + lVar1 + 4) = (int)peVar16;
  *(undefined8 *)((long)auStack_958 + lVar1 + 0x10) = 0x101f0c;
  uVar5 = epoll_create1(0);
  if (uVar5 == 0xffffffff) {
    *(undefined8 *)((long)auStack_958 + lVar1 + 0x10) = 0x101f41;
    vfio_epoll_ctl_cold_2();
  }
  else {
    __events = (epoll_event *)(ulong)uVar5;
    *(undefined8 *)((long)auStack_958 + lVar1 + 0x10) = 0x101f26;
    iVar4 = epoll_ctl(uVar5,1,(int)peVar16,(epoll_event *)((long)aeStack_93c + lVar1));
    if (iVar4 != -1) {
      return uVar5;
    }
  }
  lVar17 = (long)aeStack_93c + lVar1 + 0xc;
  *(code **)((long)auStack_958 + lVar1 + 0x10) = vfio_init;
  vfio_epoll_ctl_cold_1();
  *(ulong *)((long)auStack_958 + lVar1 + 0x10) = (ulong)peVar16 & 0xffffffff;
  *(ulong **)((long)auStack_958 + lVar1 + 8) = puVar18;
  *(epoll_event **)((long)auStack_958 + lVar1) = __events;
  *(undefined8 *)((long)&lStack_2c00 + lVar1) = 0x101f7a;
  snprintf(acStack_1958 + lVar1,0x1000,"/sys/bus/pci/devices/%s/",lVar17);
  *(undefined8 *)((long)&lStack_2c00 + lVar1) = 0x101f8a;
  iVar4 = stat(acStack_1958 + lVar1,(stat *)((long)&sStack_29e8 + lVar1));
  if (iVar4 < 0) {
    return -1;
  }
  pcVar11 = acStack_1958 + lVar1;
  *(undefined8 *)((long)&lStack_2c00 + lVar1) = 0x101fa2;
  sVar10 = strlen(pcVar11);
  *(undefined8 *)((long)&lStack_2c00 + lVar1) = 0x101fb9;
  strncat(pcVar11,"iommu_group",0xfff - sVar10);
  __buf = acStack_2958 + lVar1;
  *(undefined8 *)((long)&lStack_2c00 + lVar1) = 0x101fce;
  sVar9 = readlink(pcVar11,__buf,0x1000);
  uVar13 = SUB84(__buf,0);
  if (sVar9 == -1) {
    *(undefined8 *)((long)&lStack_2c00 + lVar1) = 0x102160;
    vfio_init_cold_11();
LAB_00102160:
    *(undefined8 *)((long)&lStack_2c00 + lVar1) = 0x10216a;
    vfio_init_cold_10();
LAB_0010216a:
    *(undefined8 *)((long)&lStack_2c00 + lVar1) = 0x102174;
    vfio_init_cold_8();
LAB_00102174:
    *(undefined8 *)((long)&lStack_2c00 + lVar1) = 0x10217e;
    vfio_init_cold_7();
LAB_0010217e:
    *(undefined8 *)((long)&lStack_2c00 + lVar1) = 0x102188;
    vfio_init_cold_6();
LAB_00102188:
    *(undefined8 *)((long)&lStack_2c00 + lVar1) = 0x102192;
    vfio_init_cold_5();
LAB_00102192:
    *(undefined8 *)((long)&lStack_2c00 + lVar1) = 0x10219c;
    vfio_init_cold_3();
LAB_0010219c:
    *(undefined8 *)((long)&lStack_2c00 + lVar1) = 0x1021a6;
    vfio_init_cold_9();
LAB_001021a6:
    *(undefined8 *)((long)&lStack_2c00 + lVar1) = 0x1021b0;
    vfio_init_cold_1();
LAB_001021b0:
    *(undefined8 *)((long)&lStack_2c00 + lVar1) = 0x1021ba;
    vfio_init_cold_2();
  }
  else {
    acStack_2958[(int)sVar9 + lVar1] = '\0';
    *(undefined8 *)((long)&lStack_2c00 + lVar1) = 0x101fef;
    pcVar11 = __xpg_basename(acStack_2958 + lVar1);
    uVar13 = 0x1034ad;
    *(undefined8 *)((long)&lStack_2c00 + lVar1) = 0x102005;
    iVar4 = __isoc99_sscanf(pcVar11,"%d",(long)&uStack_2bf4 + lVar1);
    if (iVar4 == -1) goto LAB_00102160;
    *(undefined8 *)((long)&lStack_2c00 + lVar1) = 0x102015;
    iVar4 = get_vfio_container();
    *(int *)((long)&iStack_2bf8 + lVar1) = iVar4;
    if (iVar4 == -1) {
      uVar13 = 2;
      *(undefined8 *)((long)&lStack_2c00 + lVar1) = 0x102032;
      iVar6 = open("/dev/vfio/vfio",2);
      if (iVar6 == -1) goto LAB_0010219c;
      *(int *)((long)&iStack_2bf8 + lVar1) = iVar6;
      *(undefined8 *)((long)&lStack_2c00 + lVar1) = 0x102045;
      set_vfio_container(iVar6);
      uVar13 = 0x3b64;
      *(undefined8 *)((long)&lStack_2c00 + lVar1) = 0x102054;
      iVar6 = ioctl(*(int *)((long)&iStack_2bf8 + lVar1),0x3b64);
      if (iVar6 != 0) goto LAB_001021a6;
      uVar13 = 0x3b65;
      *(undefined8 *)((long)&lStack_2c00 + lVar1) = 0x102070;
      iVar6 = ioctl(*(int *)((long)&iStack_2bf8 + lVar1),0x3b65,1);
      if (iVar6 == 1) goto LAB_00102079;
      goto LAB_001021b0;
    }
LAB_00102079:
    *(undefined8 *)((long)&lStack_2c00 + lVar1) = 0x10209b;
    snprintf(acStack_1958 + lVar1,0x1000,"/dev/vfio/%d",(ulong)*(uint *)((long)&uStack_2bf4 + lVar1)
            );
    uVar13 = 2;
    *(undefined8 *)((long)&lStack_2c00 + lVar1) = 0x1020aa;
    iVar6 = open(acStack_1958 + lVar1,2);
    if (iVar6 == -1) goto LAB_0010216a;
    *(undefined8 *)((long)&uStack_2bf0 + lVar1) = 8;
    uVar13 = 0x3b67;
    *(undefined8 *)((long)&lStack_2c00 + lVar1) = 0x1020d0;
    iVar7 = ioctl(iVar6,0x3b67);
    if (iVar7 == -1) goto LAB_00102174;
    if ((auStack_2be8[lVar1 + -4] & 1) == 0) goto LAB_0010217e;
    uVar13 = 0x3b68;
    *(undefined8 *)((long)&lStack_2c00 + lVar1) = 0x1020f6;
    iVar7 = ioctl(iVar6,0x3b68,(long)&iStack_2bf8 + lVar1);
    if (iVar7 == -1) goto LAB_00102188;
    if (iVar4 != -1) {
LAB_00102121:
      uVar13 = 0x3b6a;
      *(undefined8 *)((long)&lStack_2c00 + lVar1) = 0x102133;
      iVar4 = ioctl(iVar6,0x3b6a,lVar17);
      if (iVar4 != -1) {
        *(undefined8 *)((long)&lStack_2c00 + lVar1) = 0x102141;
        vfio_enable_dma(iVar4);
        return iVar4;
      }
      goto LAB_00102192;
    }
    uVar13 = 0x3b66;
    *(undefined8 *)((long)&lStack_2c00 + lVar1) = 0x102118;
    iVar4 = ioctl(*(int *)((long)&iStack_2bf8 + lVar1),0x3b66,1);
    if (iVar4 != -1) goto LAB_00102121;
  }
  iVar4 = (int)auStack_2be8 + (int)lVar1;
  *(code **)((long)&lStack_2c00 + lVar1) = vfio_map_region;
  vfio_init_cold_4();
  *(long *)((long)&lStack_2c00 + lVar1) = lVar17;
  *(undefined8 *)((long)auStack_2e28 + lVar1 + 8) = 0x20;
  *(undefined8 *)((long)asStack_2e18 + lVar1) = 0;
  *(undefined8 *)((long)asStack_2e18 + lVar1 + 8) = 0;
  *(undefined8 *)((long)asStack_2e18 + lVar1 + 0x10) = 0;
  *(undefined4 *)((long)asStack_2e18 + lVar1) = uVar13;
  *(undefined8 *)((long)auStack_2e28 + lVar1) = 0x1021ef;
  iVar6 = ioctl(iVar4,0x3b6c);
  if (iVar6 != -1) {
    sVar10 = *(size_t *)((long)asStack_2e18 + lVar1 + 8);
    __offset = *(__off_t *)((long)asStack_2e18 + lVar1 + 0x10);
    *(undefined8 *)((long)auStack_2e28 + lVar1) = 0x102212;
    pvVar12 = mmap((void *)0x0,sVar10,3,1,iVar4,__offset);
    if (pvVar12 != (void *)0xffffffffffffffff) goto LAB_00102229;
    *(undefined8 *)((long)auStack_2e28 + lVar1) = 0x102222;
    vfio_map_region_cold_1();
  }
  pvVar12 = (void *)0xffffffffffffffff;
LAB_00102229:
  return (int)pvVar12;
}

Assistant:

int vfio_disable_msix(int device_fd) {
	info("Disable MSIX Interrupts");
	struct vfio_irq_set* irq_set;
	char irq_set_buf[MSIX_IRQ_SET_BUF_LEN];

	irq_set = (struct vfio_irq_set*) irq_set_buf;
	irq_set->argsz = sizeof(struct vfio_irq_set);
	irq_set->count = 0;
	irq_set->flags = VFIO_IRQ_SET_DATA_NONE | VFIO_IRQ_SET_ACTION_TRIGGER;
	irq_set->index = VFIO_PCI_MSIX_IRQ_INDEX;
	irq_set->start = 0;

	check_err(ioctl(device_fd, VFIO_DEVICE_SET_IRQS, irq_set), "disable MSIX interrupt");

	return 0;
}